

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

void xmlParserCheckEOF(xmlParserCtxtPtr ctxt,xmlParserErrors code)

{
  xmlParserInputPtr input;
  xmlChar *pxVar1;
  xmlParserInputBufferPtr input_00;
  xmlChar *pxVar2;
  xmlCharEncError xVar3;
  size_t sizeOut;
  size_t local_30;
  
  if (ctxt->errNo == 0) {
    input = ctxt->input;
    pxVar1 = input->cur;
    if (pxVar1 < input->end) {
      xmlFatalErr(ctxt,code,(char *)0x0);
      return;
    }
    input_00 = input->buf;
    if ((input_00 != (xmlParserInputBufferPtr)0x0) &&
       (input_00->encoder != (xmlCharEncodingHandlerPtr)0x0)) {
      pxVar2 = input->base;
      local_30 = 0x40;
      xVar3 = xmlCharEncInput(input_00,&local_30,1);
      xmlBufUpdateInput(input_00->buffer,input,(long)pxVar1 - (long)pxVar2);
      if (xVar3 == XML_ENC_ERR_SUCCESS) {
        if (input->cur < input->end) {
          xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"expected EOF");
        }
      }
      else {
        xmlCtxtErrIO(ctxt,input_00->error,(char *)0x0);
      }
    }
  }
  return;
}

Assistant:

void
xmlParserCheckEOF(xmlParserCtxtPtr ctxt, xmlParserErrors code) {
    xmlParserInputPtr in = ctxt->input;
    xmlParserInputBufferPtr buf;

    if (ctxt->errNo != XML_ERR_OK)
        return;

    if (in->cur < in->end) {
        xmlFatalErr(ctxt, code, NULL);
        return;
    }

    buf = in->buf;
    if ((buf != NULL) && (buf->encoder != NULL)) {
        size_t curBase = in->cur - in->base;
        size_t sizeOut = 64;
        xmlCharEncError ret;

        /*
         * Check for truncated multi-byte sequence
         */
        ret = xmlCharEncInput(buf, &sizeOut, /* flush */ 1);
        xmlBufUpdateInput(buf->buffer, in, curBase);
        if (ret != XML_ENC_ERR_SUCCESS) {
            xmlCtxtErrIO(ctxt, buf->error, NULL);
            return;
        }

        /* Shouldn't happen */
        if (in->cur < in->end)
            xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR, "expected EOF");
    }
}